

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

char * getMissingLimit(char *s)

{
  int iVar1;
  char *pcVar2;
  char *s0;
  char *s_local;
  
  pcVar2 = u_skipWhitespace(s);
  s_local = s;
  if ((*pcVar2 == '#') && (pcVar2 = u_skipWhitespace(pcVar2 + 1), *pcVar2 == '@')) {
    pcVar2 = u_skipWhitespace(pcVar2 + 1);
    iVar1 = strncmp(pcVar2,"missing",7);
    if ((iVar1 == 0) && (pcVar2 = u_skipWhitespace(pcVar2 + 7), *pcVar2 == ':')) {
      s_local = u_skipWhitespace(pcVar2 + 1);
    }
  }
  return s_local;
}

Assistant:

static const char *
getMissingLimit(const char *s) {
    const char *s0=s;
    if(
        *(s=u_skipWhitespace(s))=='#' &&
        *(s=u_skipWhitespace(s+1))=='@' &&
        0==strncmp((s=u_skipWhitespace(s+1)), "missing", 7) &&
        *(s=u_skipWhitespace(s+7))==':'
    ) {
        return u_skipWhitespace(s+1);
    } else {
        return s0;
    }
}